

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

void __thiscall
ON_MeshParameters::Internal_SetDoubleHelper
          (ON_MeshParameters *this,double x,double minx,double maxx,double *dest)

{
  bool bVar1;
  double *dest_local;
  double maxx_local;
  double minx_local;
  double x_local;
  ON_MeshParameters *this_local;
  
  bVar1 = ON_IsValid(x);
  if (((bVar1) && (((minx == -1.23432101234321e+308 && (!NAN(minx))) || (minx <= x)))) &&
     ((((maxx == -1.23432101234321e+308 && (!NAN(maxx))) || (x <= maxx)) &&
      ((x != *dest || (NAN(x) || NAN(*dest))))))) {
    *(undefined8 *)(this->m_geometry_settings_hash).m_digest =
         ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
    *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8) =
         ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
    *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10) =
         ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
    *dest = x;
  }
  return;
}

Assistant:

void ON_MeshParameters::Internal_SetDoubleHelper(double x, double minx, double maxx, double* dest)
{
  if (!ON_IsValid(x))
    return;
  if (ON_UNSET_VALUE != minx && !(x >= minx))
    return;
  if (ON_UNSET_VALUE != maxx && !(x <= maxx))
    return;
  if (x == *dest)
    return;
  m_geometry_settings_hash = ON_SHA1_Hash::ZeroDigest;
  *dest = x;
}